

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_outs(DisasContext *s,MemOp ot)

{
  TCGContext *tcg_ctx_00;
  uint32_t uVar1;
  TCGContext *tcg_ctx;
  MemOp ot_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = tb_cflags((s->base).tb);
  if ((uVar1 & 0x20000) != 0) {
    gen_io_start(tcg_ctx_00);
  }
  gen_string_movl_A0_ESI(s);
  gen_op_ld_v(s,ot,s->T0,s->A0);
  tcg_gen_extrl_i64_i32_x86_64(tcg_ctx_00,s->tmp2_i32,tcg_ctx_00->cpu_regs[2]);
  tcg_gen_andi_i32_x86_64(tcg_ctx_00,s->tmp2_i32,s->tmp2_i32,0xffff);
  tcg_gen_extrl_i64_i32_x86_64(tcg_ctx_00,s->tmp3_i32,s->T0);
  gen_helper_out_func(tcg_ctx_00,ot,s->tmp2_i32,s->tmp3_i32);
  gen_op_movl_T0_Dshift(s,ot);
  gen_op_add_reg_T0(s,s->aflag,6);
  gen_bpt_io(s,s->tmp2_i32,ot);
  uVar1 = tb_cflags((s->base).tb);
  if ((uVar1 & 0x20000) != 0) {
    gen_io_end(tcg_ctx_00);
  }
  return;
}

Assistant:

static inline void gen_outs(DisasContext *s, MemOp ot)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    if (tb_cflags(s->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_string_movl_A0_ESI(s);
    gen_op_ld_v(s, ot, s->T0, s->A0);

    tcg_gen_trunc_tl_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_regs[R_EDX]);
    tcg_gen_andi_i32(tcg_ctx, s->tmp2_i32, s->tmp2_i32, 0xffff);
    tcg_gen_trunc_tl_i32(tcg_ctx, s->tmp3_i32, s->T0);
    gen_helper_out_func(tcg_ctx, ot, s->tmp2_i32, s->tmp3_i32);
    gen_op_movl_T0_Dshift(s, ot);
    gen_op_add_reg_T0(s, s->aflag, R_ESI);
    gen_bpt_io(s, s->tmp2_i32, ot);
    if (tb_cflags(s->base.tb) & CF_USE_ICOUNT) {
        gen_io_end(tcg_ctx);
    }
}